

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
beast::lexicalCastThrow<std::__cxx11::string,unsigned_short>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,beast *this,unsigned_short in)

{
  bool bVar1;
  BadLexicalCast *this_00;
  unsigned_short in_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = lexicalCastChecked<std::__cxx11::string,unsigned_short>
                    (__return_storage_ptr__,(unsigned_short)this);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (BadLexicalCast *)__cxa_allocate_exception(8);
  *this_00 = (BadLexicalCast)0x0;
  BadLexicalCast::BadLexicalCast(this_00);
  __cxa_throw(this_00,&BadLexicalCast::typeinfo,BadLexicalCast::~BadLexicalCast);
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}